

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollDirection direction,bool page,bool active)

{
  quint8 *pqVar1;
  QWidget *this_00;
  ulong uVar2;
  QRect *pQVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  QStyle *pQVar10;
  ScrollLocation location;
  QAction *action;
  long lVar11;
  Representation *pRVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  
  if ((this->scroll != (QMenuScroller *)0x0) &&
     ((this->scroll->scrollFlags & direction) != ScrollNone)) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    updateActionRects(this);
    bVar5 = this->scroll->scrollFlags;
    iVar7 = 0;
    iVar6 = 0;
    if ((bVar5 & 1) != 0) {
      iVar6 = scrollerHeight(this);
      bVar5 = this->scroll->scrollFlags;
    }
    if ((bVar5 & 2) != 0) {
      iVar7 = scrollerHeight(this);
    }
    pQVar10 = QWidget::style(this_00);
    iVar16 = 0;
    iVar8 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x1d,0,this_00);
    pQVar10 = QWidget::style(this_00);
    iVar9 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x1e,0,this_00);
    iVar8 = iVar6 - iVar8;
    if (iVar6 == 0) {
      iVar8 = 0;
    }
    if (direction == ScrollUp) {
      pQVar3 = (this->actionRects).d.ptr;
      lVar4 = 0;
      do {
        lVar11 = lVar4;
        if ((this->super_QWidgetPrivate).actions.d.size << 3 == lVar11) {
          return;
        }
        iVar16 = iVar16 + ~*(uint *)((long)&(pQVar3->y2).m_i + lVar11 * 2) +
                 *(int *)((long)&(pQVar3->y1).m_i + lVar11 * 2);
        lVar4 = lVar11 + 8;
      } while (this->scroll->scrollOffset - iVar8 < iVar16);
      action = *(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar11);
      location = ScrollTop - page;
      goto LAB_0042218e;
    }
    if (direction == ScrollDown) {
      location = page + ScrollBottom;
      uVar2 = (this->super_QWidgetPrivate).actions.d.size;
      pRVar12 = &(this->actionRects).d.ptr[1].y2;
      iVar16 = 0;
      for (uVar13 = 1; uVar13 - 1 < uVar2; uVar13 = uVar13 + 1) {
        iVar16 = iVar16 + ~*(uint *)(pRVar12 + -4) + pRVar12[-6].m_i;
        iVar15 = this->scroll->scrollOffset;
        if (iVar16 <= iVar15 - iVar8) {
          iVar15 = iVar15 - (iVar16 + iVar8);
          goto LAB_00422162;
        }
        pRVar12 = pRVar12 + 4;
      }
LAB_004221a4:
      pqVar1 = &this->scroll->scrollFlags;
      *pqVar1 = *pqVar1 & 0xfd;
      QWidget::update(this_00);
      return;
    }
  }
  return;
  while( true ) {
    iVar15 = ((iVar15 + pRVar12->m_i) - pRVar12[-2].m_i) + 1;
    pRVar12 = pRVar12 + 4;
    uVar13 = uVar14 + 1;
    if (((1 - (iVar6 + iVar7 + iVar9 * 2)) + (this_00->data->crect).y2.m_i) -
        (this_00->data->crect).y1.m_i < iVar15) break;
LAB_00422162:
    uVar14 = uVar13;
    if (uVar2 <= uVar14) goto LAB_004221a4;
  }
  action = (this->super_QWidgetPrivate).actions.d.ptr[uVar14];
LAB_0042218e:
  scrollMenu(this,action,location,active);
  return;
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollDirection direction, bool page, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !(scroll->scrollFlags & direction)) //not really possible...
        return;
    updateActionRects();
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);
    const int offset = topScroll ? topScroll-vmargin : 0;
    if (direction == QMenuScroller::ScrollUp) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum -= actionRects.at(i).height();
            if (saccum <= scroll->scrollOffset-offset) {
                scrollMenu(actions.at(i), page ? QMenuScroller::ScrollBottom : QMenuScroller::ScrollTop, active);
                break;
            }
        }
    } else if (direction == QMenuScroller::ScrollDown) {
        bool scrolled = false;
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            const int iHeight = actionRects.at(i).height();
            saccum -= iHeight;
            if (saccum <= scroll->scrollOffset-offset) {
                const int scrollerArea = q->height() - botScroll - fw*2;
                int visible = (scroll->scrollOffset-offset) - saccum;
                for(i++ ; i < actions.size(); i++) {
                    visible += actionRects.at(i).height();
                    if (visible > scrollerArea - topScroll) {
                        scrolled = true;
                        scrollMenu(actions.at(i), page ? QMenuScroller::ScrollTop : QMenuScroller::ScrollBottom, active);
                        break;
                    }
                }
                break;
            }
        }
        if (!scrolled) {
            scroll->scrollFlags &= ~QMenuScroller::ScrollDown;
            q->update();
        }
    }
}